

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::Identifier::~Identifier(Identifier *this)

{
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__Identifier_001f1af0;
  std::__cxx11::string::~string((string *)&this->val);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_ASTNode).super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this
              .super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

explicit Identifier(std::string val) : val(std::move(val)) {}